

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Track::AddContentEncoding(Track *this)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  long in_RDI;
  uint32_t i;
  ContentEncoding *content_encoding;
  ContentEncoding **content_encoding_entries;
  uint32_t count;
  ContentEncoding *in_stack_ffffffffffffff90;
  void *local_58;
  uint local_48;
  bool local_1;
  
  uVar2 = *(int *)(in_RDI + 0x70) + 1;
  auVar1 = ZEXT416(uVar2) * ZEXT816(8);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3,(nothrow_t *)&std::nothrow);
  if (pvVar4 == (void *)0x0) {
    local_1 = false;
  }
  else {
    pvVar5 = operator_new(0x38,(nothrow_t *)&std::nothrow);
    local_58 = (void *)0x0;
    if (pvVar5 != (void *)0x0) {
      ContentEncoding::ContentEncoding(in_stack_ffffffffffffff90);
      local_58 = pvVar5;
    }
    if (local_58 == (void *)0x0) {
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
      local_1 = false;
    }
    else {
      for (local_48 = 0; local_48 < *(uint *)(in_RDI + 0x70); local_48 = local_48 + 1) {
        *(undefined8 *)((long)pvVar4 + (ulong)local_48 * 8) =
             *(undefined8 *)(*(long *)(in_RDI + 0x68) + (ulong)local_48 * 8);
      }
      if (*(void **)(in_RDI + 0x68) != (void *)0x0) {
        operator_delete__(*(void **)(in_RDI + 0x68));
      }
      *(void **)(in_RDI + 0x68) = pvVar4;
      *(void **)(*(long *)(in_RDI + 0x68) + (ulong)*(uint *)(in_RDI + 0x70) * 8) = local_58;
      *(uint *)(in_RDI + 0x70) = uVar2;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Track::AddContentEncoding() {
  const uint32_t count = content_encoding_entries_size_ + 1;

  ContentEncoding** const content_encoding_entries =
      new (std::nothrow) ContentEncoding*[count];  // NOLINT
  if (!content_encoding_entries)
    return false;

  ContentEncoding* const content_encoding =
      new (std::nothrow) ContentEncoding();  // NOLINT
  if (!content_encoding) {
    delete[] content_encoding_entries;
    return false;
  }

  for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
    content_encoding_entries[i] = content_encoding_entries_[i];
  }

  delete[] content_encoding_entries_;

  content_encoding_entries_ = content_encoding_entries;
  content_encoding_entries_[content_encoding_entries_size_] = content_encoding;
  content_encoding_entries_size_ = count;
  return true;
}